

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86_avx512::forward
          (MultiHeadAttention_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  Allocator *pAVar8;
  int iVar9;
  void *pvVar10;
  Allocator *pAVar11;
  undefined4 uVar12;
  long *plVar13;
  undefined4 uVar14;
  int iVar15;
  int _w;
  int iVar16;
  long lVar17;
  pointer pMVar18;
  void *pvVar19;
  long *plVar20;
  void *pvVar21;
  long lVar22;
  int *piVar23;
  long lVar24;
  long lVar25;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  long local_390;
  long local_388;
  value_type local_378;
  long local_330;
  Mat local_328;
  MultiHeadAttention_x86_avx512 *local_2d8;
  int *local_2d0;
  Mat local_2c8;
  Mat local_278;
  vector<int,_std::allocator<int>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  Mat local_1e8;
  long local_1a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_198;
  pointer local_190;
  void *local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 local_170;
  long *local_168;
  undefined4 uStack_160;
  int iStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined8 local_148;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_f0;
  undefined1 local_d8 [72];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_90;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_78;
  int iStack_60;
  bool bStack_5c;
  bool bStack_5b;
  bool bStack_5a;
  bool bStack_59;
  Allocator *pAStack_58;
  int iStack_50;
  bool bStack_4c;
  bool bStack_4b;
  bool bStack_4a;
  bool bStack_49;
  int iStack_48;
  bool bStack_44;
  bool bStack_43;
  bool bStack_42;
  bool bStack_41;
  bool bStack_40;
  bool bStack_3f;
  bool bStack_3e;
  bool bStack_3d;
  bool bStack_3c;
  bool bStack_3b;
  bool bStack_3a;
  bool bStack_39;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar17 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  pMVar18 = pMVar4;
  local_190 = pMVar4;
  if (lVar17 == 0x48) {
    iVar16 = (this->super_MultiHeadAttention).attn_mask;
LAB_0051fc31:
    if (iVar16 != 0) goto LAB_0051fc7f;
    local_2c8.cstep = 0;
    local_2c8.data = (void *)0x0;
    local_2c8.refcount._0_4_ = 0;
    local_2c8.refcount._4_4_ = 0;
    local_2c8.elemsize._0_4_ = 0;
    local_2c8.elemsize._4_4_ = 0;
    local_2c8.elempack = 0;
    local_2c8.allocator = (Allocator *)0x0;
    local_2c8.dims = 0;
    local_2c8.w = 0;
    local_2c8.h = 0;
    local_2c8.d = 0;
    local_2c8.c = 0;
  }
  else {
    iVar16 = (this->super_MultiHeadAttention).attn_mask;
    if (iVar16 == 0 || lVar17 != 0x90) {
      pMVar18 = pMVar4 + 1;
      local_190 = pMVar18;
      if (iVar16 == 0) {
        local_190 = pMVar4 + 2;
      }
      if (lVar17 != 0xd8) {
        local_190 = pMVar4 + 2;
      }
      if (lVar17 == 0x90) {
        local_190 = pMVar18;
      }
      goto LAB_0051fc31;
    }
LAB_0051fc7f:
    piVar23 = *(int **)((long)pMVar4 + lVar17 + -0x40);
    puVar1 = (undefined8 *)((long)pMVar4 + lVar17 + -0x48);
    local_2c8.data = (void *)*puVar1;
    uVar5 = puVar1[1];
    local_2c8.refcount._0_4_ = (undefined4)uVar5;
    local_2c8.refcount._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)((long)pMVar4 + lVar17 + -0x38);
    local_2c8.elemsize._0_4_ = (undefined4)uVar5;
    local_2c8.elemsize._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    local_2c8.elempack = *(int *)((long)pMVar4 + lVar17 + -0x30);
    local_2c8.allocator = *(Allocator **)((long)pMVar4 + lVar17 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar4 + lVar17 + -0x20);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    local_2c8.dims = (int)uVar5;
    local_2c8.w = (int)((ulong)uVar5 >> 0x20);
    local_2c8.h = (int)uVar6;
    local_2c8.d = (int)((ulong)uVar6 >> 0x20);
    local_2c8.c = *(int *)((long)pMVar4 + lVar17 + -0x10);
    local_2c8.cstep = *(ulong *)((long)pMVar4 + lVar17 + -8);
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + 1;
      UNLOCK();
    }
  }
  local_2d0 = &(this->super_MultiHeadAttention).attn_mask;
  local_d8[0] = _opt->lightmode;
  local_d8[1] = _opt->use_shader_pack8;
  local_d8[2] = _opt->use_subgroup_ops;
  local_d8[3] = _opt->use_reserved_0;
  local_d8._4_4_ = _opt->num_threads;
  local_d8._8_8_ = _opt->blob_allocator;
  local_d8._16_8_ = _opt->workspace_allocator;
  local_d8._24_4_ = _opt->openmp_blocktime;
  local_d8[0x1c] = _opt->use_winograd_convolution;
  local_d8[0x1d] = _opt->use_sgemm_convolution;
  local_d8[0x1e] = _opt->use_int8_inference;
  local_d8[0x1f] = _opt->use_vulkan_compute;
  local_d8._32_8_ = *(undefined8 *)&_opt->use_bf16_storage;
  local_d8._40_4_ = _opt->vulkan_device_index;
  local_d8[0x2c] = _opt->use_reserved_1;
  local_d8[0x2d] = _opt->use_image_storage;
  local_d8[0x2e] = _opt->use_tensor_storage;
  local_d8[0x2f] = _opt->use_reserved_2;
  local_d8._48_4_ = _opt->flush_denormals;
  local_d8[0x34] = _opt->use_local_pool_allocator;
  local_d8[0x35] = _opt->use_shader_local_memory;
  local_d8[0x36] = _opt->use_cooperative_matrix;
  local_d8[0x37] = _opt->use_winograd23_convolution;
  local_d8[0x38] = _opt->use_winograd43_convolution;
  local_d8[0x39] = _opt->use_winograd63_convolution;
  local_d8[0x3a] = _opt->use_a53_a55_optimized_kernel;
  local_d8[0x3b] = _opt->use_fp16_uniform;
  local_d8[0x3c] = _opt->use_int8_uniform;
  local_d8[0x3d] = _opt->use_reserved_9;
  local_d8[0x3e] = _opt->use_reserved_10;
  local_d8[0x3f] = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_d8._32_8_ = local_d8._32_8_ & 0xffffffffffffff;
  }
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  local_198 = top_blobs;
  if ((*local_2d0 == 0) || (local_2c8.elempack == 1)) {
    piVar23 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + 1;
      UNLOCK();
    }
    local_328.data = local_2c8.data;
    local_328.refcount._0_4_ = local_2c8.refcount._0_4_;
    local_328.refcount._4_4_ = local_2c8.refcount._4_4_;
    local_328.elemsize._0_4_ = (undefined4)local_2c8.elemsize;
    local_328.elemsize._4_4_ = local_2c8.elemsize._4_4_;
    local_328.elempack = local_2c8.elempack;
    local_328.allocator = local_2c8.allocator;
    local_328.dims = local_2c8.dims;
    local_328.w = local_2c8.w;
    local_328.h = local_2c8.h;
    local_328.d = local_2c8.d;
    local_328.c = local_2c8.c;
    local_328.cstep = local_2c8.cstep;
  }
  else {
    convert_packing(&local_2c8,&local_328,1,(Option *)local_d8);
    iVar16 = -100;
    if ((local_328.data == (void *)0x0) || ((long)local_328.c * local_328.cstep == 0))
    goto LAB_00520543;
  }
  iVar15 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar4->elempack * pMVar4->h;
  iVar2 = pMVar18->elempack;
  iVar3 = pMVar18->h;
  local_f8 = 0;
  local_138 = (void *)0x0;
  uStack_130 = 0;
  uStack_12c = 0;
  local_128 = 0;
  uStack_124 = 0;
  local_120 = 0;
  local_118 = (long *)0x0;
  uStack_110 = 0;
  iStack_10c = 0;
  uStack_108 = 0;
  uStack_104 = 0;
  local_100 = 0;
  iVar16 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar4,&local_138,local_d8);
  if (iVar16 == 0) {
    local_148 = 0;
    local_188 = (void *)0x0;
    uStack_180 = 0;
    uStack_17c = 0;
    local_178 = 0;
    uStack_174 = 0;
    local_170 = 0;
    local_168 = (long *)0x0;
    uStack_160 = 0;
    iStack_15c = 0;
    uStack_158 = 0;
    uStack_154 = 0;
    local_150 = 0;
    iVar16 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar18,&local_188,local_d8);
    if (iVar16 == 0) {
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.allocator = (Allocator *)0x0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      Mat::create(&local_1e8,iVar2 * iVar3,(this->super_MultiHeadAttention).num_heads * _w,4,
                  (Allocator *)local_d8._8_8_);
      iVar16 = -100;
      if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_208,(long)(this->super_MultiHeadAttention).num_heads);
        if (0 < (this->super_MultiHeadAttention).num_heads) {
          lVar17 = (long)iVar15;
          local_1a0 = (long)_w;
          lVar22 = 0;
          local_330 = 0;
          local_388 = 0;
          local_2d8 = this;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_278,2,
                       (allocator_type *)&local_378);
            iVar16 = iStack_10c;
            plVar20 = local_118;
            uVar14 = local_120;
            pvVar19 = local_278.data;
            lVar24 = (long)iStack_10c;
            lVar25 = CONCAT44(uStack_124,local_128);
            pvVar21 = (void *)(lVar22 * lVar24 * lVar25 + (long)local_138);
            piVar23 = *(int **)((long)local_278.data + 8);
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (*(long **)((long)local_278.data + 0x20) == (long *)0x0) {
                  if (*local_278.data != (void *)0x0) {
                    free(*local_278.data);
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_278.data + 0x20) + 0x18))();
                }
              }
            }
            iVar2 = iStack_15c;
            plVar13 = local_168;
            uVar12 = local_170;
            pvVar10 = local_278.data;
            *(void **)pvVar19 = pvVar21;
            *(long *)((long)pvVar19 + 8) = 0;
            *(long *)((long)pvVar19 + 0x10) = lVar25;
            *(undefined4 *)((long)pvVar19 + 0x18) = uVar14;
            *(long **)((long)pvVar19 + 0x20) = plVar20;
            *(undefined4 *)((long)pvVar19 + 0x28) = 2;
            *(int *)((long)pvVar19 + 0x2c) = iVar16;
            *(int *)((long)pvVar19 + 0x30) = iVar15;
            *(undefined8 *)((long)pvVar19 + 0x34) = 0x100000001;
            *(long *)((long)pvVar19 + 0x40) = lVar24 * lVar17;
            lVar24 = (long)iStack_15c;
            lVar25 = CONCAT44(uStack_174,local_178);
            piVar23 = *(int **)((long)local_278.data + 0x50);
            pvVar19 = (void *)(lVar22 * lVar24 * lVar25 + (long)local_188);
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (*(long **)((long)local_278.data + 0x68) == (long *)0x0) {
                  if (*(void **)((long)local_278.data + 0x48) != (void *)0x0) {
                    free(*(void **)((long)local_278.data + 0x48));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_278.data + 0x68) + 0x18))();
                }
              }
            }
            *(void **)((long)pvVar10 + 0x48) = pvVar19;
            *(long *)((long)pvVar10 + 0x50) = 0;
            *(long *)((long)pvVar10 + 0x58) = lVar25;
            *(undefined4 *)((long)pvVar10 + 0x60) = uVar12;
            *(long **)((long)pvVar10 + 0x68) = plVar13;
            *(undefined4 *)((long)pvVar10 + 0x70) = 2;
            *(int *)((long)pvVar10 + 0x74) = iVar2;
            *(int *)((long)pvVar10 + 0x78) = iVar15;
            *(undefined8 *)((long)pvVar10 + 0x7c) = 0x100000001;
            *(long *)((long)pvVar10 + 0x88) = lVar24 * lVar17;
            if (*local_2d0 != 0) {
              if (local_328.dims == 3) {
                local_378.cstep = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
                local_378.data =
                     (void *)(local_328.cstep * local_388 * local_378.cstep + (long)local_328.data);
                local_378.refcount._0_4_ = 0;
                local_378.refcount._4_4_ = 0;
                local_378.d = 1;
                local_378.c = local_328.d;
                local_378.cstep =
                     ((long)local_328.h * (long)local_328.w * local_378.cstep + 0xf &
                     0xfffffffffffffff0) / local_378.cstep;
                local_378.dims = 2;
              }
              else {
                piVar23 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
                local_378.data = local_328.data;
                local_378.refcount._0_4_ = local_328.refcount._0_4_;
                local_378.refcount._4_4_ = local_328.refcount._4_4_;
                local_378.dims = local_328.dims;
                local_378.d = local_328.d;
                local_378.c = local_328.c;
                local_378.cstep = local_328.cstep;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + 1;
                  UNLOCK();
                }
              }
              local_378.h = local_328.h;
              local_378.w = local_328.w;
              local_378.allocator = local_328.allocator;
              local_378.elempack = local_328.elempack;
              local_378.elemsize._4_4_ = local_328.elemsize._4_4_;
              local_378.elemsize._0_4_ = (undefined4)local_328.elemsize;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_278,&local_378);
              piVar23 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if (local_378.data != (void *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&local_78,1,(allocator_type *)&local_378);
            pMVar18 = local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar2 = local_1e8.w;
            pAVar11 = local_1e8.allocator;
            iVar16 = local_1e8.elempack;
            lVar25 = (long)local_1e8.w;
            sVar7 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
            pvVar19 = (void *)(local_330 * lVar25 * sVar7 + (long)local_1e8.data);
            piVar23 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->data != (void *)0x0) {
                    free((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start)->data);
                  }
                }
                else {
                  (*(local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            lVar24 = local_1a0;
            this = local_2d8;
            pMVar18->data = pvVar19;
            pMVar18->refcount = (int *)0x0;
            pMVar18->elemsize = sVar7;
            pMVar18->elempack = iVar16;
            pMVar18->allocator = pAVar11;
            pMVar18->dims = 2;
            pMVar18->w = iVar2;
            pMVar18->h = _w;
            pMVar18->d = 1;
            pMVar18->c = 1;
            pMVar18->cstep = lVar25 * local_1a0;
            local_378.refcount._0_4_ = (undefined4)local_d8._8_8_;
            local_378.refcount._4_4_ = SUB84(local_d8._8_8_,4);
            local_378.elemsize._0_4_ = (undefined4)local_d8._16_8_;
            local_378.elemsize._4_4_ = SUB84(local_d8._16_8_,4);
            local_378.elempack = (int)local_d8._24_8_;
            local_378._28_4_ = SUB84(local_d8._24_8_,4);
            local_378.allocator = (Allocator *)local_d8._32_8_;
            local_378.dims = (int)local_d8._40_8_;
            local_378.w = SUB84(local_d8._40_8_,4);
            local_378.h = (int)local_d8._48_8_;
            local_378.d = SUB84(local_d8._48_8_,4);
            local_378.c = (int)local_d8._56_8_;
            local_378._60_4_ = SUB84(local_d8._56_8_,4);
            local_378.data = (void *)CONCAT44(1,(int)local_d8._0_8_);
            iVar16 = (*local_2d8->qk_gemm->_vptr_Layer[6])
                               (local_2d8->qk_gemm,&local_278,&local_78,&local_378);
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_388] = iVar16;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_78);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_278);
            local_388 = local_388 + 1;
            iVar2 = (this->super_MultiHeadAttention).num_heads;
            local_330 = local_330 + lVar24;
            lVar22 = lVar22 + lVar17;
          } while (local_388 < iVar2);
          if (0 < iVar2) {
            lVar17 = 0;
            do {
              iVar16 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
              if (iVar16 != 0) goto LAB_005206b0;
              lVar17 = lVar17 + 1;
            } while (iVar2 != lVar17);
          }
        }
        piVar23 = (int *)CONCAT44(uStack_12c,uStack_130);
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if (local_118 == (long *)0x0) {
              if (local_138 != (void *)0x0) {
                free(local_138);
              }
            }
            else {
              (**(code **)(*local_118 + 0x18))();
            }
          }
        }
        local_f8 = 0;
        local_138 = (void *)0x0;
        uStack_130 = 0;
        uStack_12c = 0;
        local_128 = 0;
        uStack_124 = 0;
        local_120 = 0;
        uStack_110 = 0;
        iStack_10c = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        local_100 = 0;
        piVar23 = (int *)CONCAT44(uStack_17c,uStack_180);
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if (local_168 == (long *)0x0) {
              if (local_188 != (void *)0x0) {
                free(local_188);
              }
            }
            else {
              (**(code **)(*local_168 + 0x18))();
            }
          }
        }
        local_148 = 0;
        local_188 = (void *)0x0;
        uStack_180 = 0;
        uStack_17c = 0;
        local_178 = 0;
        uStack_174 = 0;
        local_170 = 0;
        uStack_160 = 0;
        iStack_15c = 0;
        uStack_158 = 0;
        uStack_154 = 0;
        local_150 = 0;
        iVar16 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_1e8,local_d8);
        if (iVar16 == 0) {
          local_378.cstep = 0;
          local_378.data = (void *)0x0;
          local_378.refcount._0_4_ = 0;
          local_378.refcount._4_4_ = 0;
          local_378.elemsize._0_4_ = 0;
          local_378.elemsize._4_4_ = 0;
          local_378.elempack = 0;
          local_378.allocator = (Allocator *)0x0;
          local_378.dims = 0;
          local_378.w = 0;
          local_378.h = 0;
          local_378.d = 0;
          local_378.c = 0;
          iVar16 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_190,&local_378,local_d8);
          if (iVar16 == 0) {
            local_278.cstep = 0;
            local_278.data = (long *)0x0;
            local_278.refcount._0_4_ = 0;
            local_278.refcount._4_4_ = 0;
            local_278.elemsize._0_4_ = 0;
            local_278.elemsize._4_4_ = 0;
            local_278.elempack = 0;
            local_278.allocator = (Allocator *)0x0;
            local_278.dims = 0;
            local_278.w = 0;
            local_278.h = 0;
            local_278.d = 0;
            local_278.c = 0;
            Mat::create(&local_278,_w,(this->super_MultiHeadAttention).num_heads * iVar15,4,
                        (Allocator *)local_d8._8_8_);
            iVar16 = -100;
            if (((long *)local_278.data != (long *)0x0) &&
               ((long)local_278.c * local_278.cstep != 0)) {
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<int,_std::allocator<int>_>::resize
                        (&local_228,(long)(this->super_MultiHeadAttention).num_heads);
              if (0 < (this->super_MultiHeadAttention).num_heads) {
                lVar22 = (long)iVar15;
                lVar17 = 0;
                local_390 = 0;
                piVar23 = (int *)0x0;
                local_2d8 = this;
                do {
                  local_2d0 = piVar23;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&local_f0,2,(allocator_type *)&local_78);
                  pMVar18 = local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar2 = local_1e8.w;
                  pAVar11 = local_1e8.allocator;
                  iVar16 = local_1e8.elempack;
                  lVar25 = (long)local_1e8.w;
                  sVar7 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                  pvVar19 = (void *)(lVar17 * lVar25 * sVar7 + (long)local_1e8.data);
                  piVar23 = (local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->refcount;
                  local_330 = lVar17;
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      if ((local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0)
                      {
                        if ((local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                          free((local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data);
                        }
                      }
                      else {
                        (*(local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])
                                  ();
                      }
                    }
                  }
                  pMVar4 = local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  iVar9 = local_378.w;
                  pAVar8 = local_378.allocator;
                  iVar3 = local_378.elempack;
                  pMVar18->data = pvVar19;
                  pMVar18->refcount = (int *)0x0;
                  pMVar18->elemsize = sVar7;
                  pMVar18->elempack = iVar16;
                  pMVar18->allocator = pAVar11;
                  pMVar18->dims = 2;
                  pMVar18->w = iVar2;
                  pMVar18->h = _w;
                  pMVar18->d = 1;
                  pMVar18->c = 1;
                  pMVar18->cstep = lVar25 * _w;
                  lVar17 = (long)local_378.w;
                  sVar7 = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
                  piVar23 = local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].refcount;
                  pvVar19 = (void *)(local_390 * lVar17 * sVar7 + (long)local_378.data);
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      if (local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                        if (local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
                          free(local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].data);
                        }
                      }
                      else {
                        (*(local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                          [3])();
                      }
                    }
                  }
                  pMVar4[1].data = pvVar19;
                  pMVar4[1].refcount = (int *)0x0;
                  pMVar4[1].elemsize = sVar7;
                  pMVar4[1].elempack = iVar3;
                  pMVar4[1].allocator = pAVar8;
                  pMVar4[1].dims = 2;
                  pMVar4[1].w = iVar9;
                  pMVar4[1].h = iVar15;
                  pMVar4[1].d = 1;
                  pMVar4[1].c = 1;
                  pMVar4[1].cstep = lVar17 * lVar22;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&local_90,1,(allocator_type *)&local_78);
                  pMVar18 = local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar2 = local_278.w;
                  pAVar11 = local_278.allocator;
                  iVar16 = local_278.elempack;
                  lVar17 = (long)local_278.w;
                  sVar7 = CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
                  plVar20 = (long *)((long)local_278.data + local_390 * lVar17 * sVar7);
                  piVar23 = (local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->refcount;
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0)
                      {
                        if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                          free((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data);
                        }
                      }
                      else {
                        (*(local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])
                                  ();
                      }
                    }
                  }
                  this = local_2d8;
                  pMVar18->data = plVar20;
                  pMVar18->refcount = (int *)0x0;
                  pMVar18->elemsize = sVar7;
                  pMVar18->elempack = iVar16;
                  pMVar18->allocator = pAVar11;
                  pMVar18->dims = 2;
                  pMVar18->w = iVar2;
                  pMVar18->h = iVar15;
                  pMVar18->d = 1;
                  pMVar18->c = 1;
                  pMVar18->cstep = lVar17 * lVar22;
                  local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
                  local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
                  iStack_60 = local_d8._24_4_;
                  bStack_5c = (bool)local_d8[0x1c];
                  bStack_5b = (bool)local_d8[0x1d];
                  bStack_5a = (bool)local_d8[0x1e];
                  bStack_59 = (bool)local_d8[0x1f];
                  pAStack_58 = (Allocator *)local_d8._32_8_;
                  iStack_50 = local_d8._40_4_;
                  bStack_4c = (bool)local_d8[0x2c];
                  bStack_4b = (bool)local_d8[0x2d];
                  bStack_4a = (bool)local_d8[0x2e];
                  bStack_49 = (bool)local_d8[0x2f];
                  iStack_48 = local_d8._48_4_;
                  bStack_44 = (bool)local_d8[0x34];
                  bStack_43 = (bool)local_d8[0x35];
                  bStack_42 = (bool)local_d8[0x36];
                  bStack_41 = (bool)local_d8[0x37];
                  bStack_40 = (bool)local_d8[0x38];
                  bStack_3f = (bool)local_d8[0x39];
                  bStack_3e = (bool)local_d8[0x3a];
                  bStack_3d = (bool)local_d8[0x3b];
                  bStack_3c = (bool)local_d8[0x3c];
                  bStack_3b = (bool)local_d8[0x3d];
                  bStack_3a = (bool)local_d8[0x3e];
                  bStack_39 = (bool)local_d8[0x3f];
                  local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)CONCAT44(1,(int)local_d8._0_8_);
                  iVar16 = (*local_2d8->qkv_gemm->_vptr_Layer[6])
                                     (local_2d8->qkv_gemm,&local_f0,&local_90,&local_78);
                  piVar23 = local_2d0;
                  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_2d0] = iVar16;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_90);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_f0);
                  piVar23 = (int *)((long)piVar23 + 1);
                  iVar2 = (this->super_MultiHeadAttention).num_heads;
                  local_390 = local_390 + lVar22;
                  lVar17 = local_330 + _w;
                } while ((long)piVar23 < (long)iVar2);
                if (0 < iVar2) {
                  lVar17 = 0;
                  do {
                    iVar16 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar17];
                    if (iVar16 != 0) goto LAB_00520c1b;
                    lVar17 = lVar17 + 1;
                  } while (iVar2 != lVar17);
                }
              }
              piVar23 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if (local_378.data != (void *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_378.cstep = 0;
              local_378.data = (void *)0x0;
              local_378.refcount._0_4_ = 0;
              local_378.refcount._4_4_ = 0;
              local_378.elemsize._0_4_ = 0;
              local_378.elemsize._4_4_ = 0;
              local_378.elempack = 0;
              local_378.dims = 0;
              local_378.w = 0;
              local_378.h = 0;
              local_378.d = 0;
              local_378.c = 0;
              iVar16 = (*this->o_gemm->_vptr_Layer[7])
                                 (this->o_gemm,&local_278,
                                  (local_198->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_start,local_d8);
              if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00520c1b:
                operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_228.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_228.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            piVar23 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (local_278.allocator == (Allocator *)0x0) {
                  if ((long *)local_278.data != (long *)0x0) {
                    free(local_278.data);
                  }
                }
                else {
                  (*(local_278.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar23 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
          if (piVar23 != (int *)0x0) {
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 == 0) {
              if (local_378.allocator == (Allocator *)0x0) {
                if (local_378.data != (void *)0x0) {
                  free(local_378.data);
                }
              }
              else {
                (*(local_378.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
LAB_005206b0:
          operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar23 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar23 = (int *)CONCAT44(uStack_17c,uStack_180);
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 == 0) {
        if (local_168 == (long *)0x0) {
          if (local_188 != (void *)0x0) {
            free(local_188);
          }
        }
        else {
          (**(code **)(*local_168 + 0x18))();
        }
      }
    }
  }
  piVar23 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_118 == (long *)0x0) {
        if (local_138 != (void *)0x0) {
          free(local_138);
        }
      }
      else {
        (**(code **)(*local_118 + 0x18))();
      }
    }
  }
LAB_00520543:
  piVar23 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if (local_328.data != (void *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar23 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

int MultiHeadAttention_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}